

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O1

int encode_decode_small(test_state *state)

{
  aec_stream *paVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  paVar1 = state->strm;
  iVar5 = aec_encode_init(paVar1);
  if (iVar5 == 0) {
    paVar1->next_in = state->ubuf;
    paVar1->avail_in = (long)state->bytes_per_sample;
    paVar1->avail_out = 1;
    paVar1->next_out = state->cbuf;
    bVar3 = 1;
    sVar6 = 0;
    uVar8 = 0;
    do {
      if (state->cbuf_len <= sVar6) break;
      if (!(bool)(~bVar3 & 1 | paVar1->avail_in != 0)) {
        uVar8 = uVar8 + (long)state->bytes_per_sample;
        if (uVar8 < state->buf_len) {
          paVar1->avail_in = (long)state->bytes_per_sample;
          paVar1->next_in = state->ubuf + uVar8;
          bVar3 = 1;
        }
        else {
          bVar3 = 0;
        }
      }
      iVar5 = aec_encode(paVar1,0);
      if (iVar5 != 0) goto LAB_001028a7;
      sVar2 = paVar1->total_out;
      if ((sVar2 == sVar6) || (state->cbuf_len <= sVar6)) {
        bVar4 = 0;
      }
      else {
        paVar1->avail_out = 1;
        paVar1->next_out = state->cbuf + sVar2;
        bVar4 = 1;
        sVar6 = sVar2;
      }
    } while ((bool)(bVar4 | bVar3));
    iVar5 = aec_encode(paVar1,1);
    if (iVar5 != 0) {
      __s = "Encode failed.";
      goto LAB_001026bd;
    }
    aec_encode_end(paVar1);
    uVar8 = paVar1->total_out;
    paVar1->avail_in = 1;
    paVar1->next_in = state->cbuf;
    paVar1->avail_out = (long)state->bytes_per_sample;
    paVar1->next_out = state->obuf;
    iVar5 = aec_decode_init(paVar1);
    if (iVar5 == 0) {
      paVar1->next_in = state->cbuf;
      paVar1->avail_in = 1;
      paVar1->avail_out = (long)state->bytes_per_sample;
      paVar1->next_out = state->obuf;
      bVar3 = 1;
      sVar6 = 0;
      uVar7 = 0;
      do {
        if (state->buf_len <= sVar6) break;
        if (!(bool)(~bVar3 & 1 | paVar1->avail_in != 0)) {
          uVar7 = uVar7 + 1;
          if (uVar7 < uVar8) {
            paVar1->avail_in = 1;
            paVar1->next_in = state->cbuf + uVar7;
            bVar3 = 1;
          }
          else {
            bVar3 = 0;
          }
        }
        iVar5 = aec_decode(paVar1,0);
        if (iVar5 != 0) goto LAB_001028a7;
        sVar2 = paVar1->total_out;
        if ((sVar2 == sVar6) || (state->buf_len <= sVar6)) {
          bVar4 = 0;
        }
        else {
          paVar1->avail_out = (long)state->bytes_per_sample;
          paVar1->next_out = state->obuf + sVar2;
          bVar4 = 1;
          sVar6 = sVar2;
        }
      } while ((bool)(bVar4 | bVar3));
      iVar5 = aec_decode(paVar1,1);
      if (iVar5 == 0) {
        iVar5 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
        if (iVar5 != 0) {
          printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
          printf("\nuncompressed buf");
          uVar7 = 0;
          do {
            if ((uVar7 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->ubuf[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x50);
          printf("\n\ncompressed buf len %li",uVar8);
          uVar8 = 0;
          do {
            if ((uVar8 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->cbuf[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x50);
          printf("\n\ndecompressed buf");
          uVar8 = 0;
          do {
            if ((uVar8 & 7) == 0) {
              printf("\n%04i ",uVar8 & 0xffffffff);
            }
            printf("%02x ",(ulong)state->obuf[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x50);
          putchar(10);
          return 99;
        }
        aec_decode_end(paVar1);
        return 0;
      }
LAB_001028a7:
      __s = "Decode failed.";
      goto LAB_001026bd;
    }
  }
  __s = "Init failed.";
LAB_001026bd:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    int status, i;
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %li", compressed_size);
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}